

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

Color __thiscall Renderer::normal(Renderer *this,Ray ray,Sampler *param_3)

{
  Color CVar1;
  bool bVar2;
  long in_RDI;
  HitInfo hit;
  HitInfo *in_stack_000000b8;
  BSDF *in_stack_000000c0;
  Hit local_70;
  long *local_28;
  vec3f local_c;
  
  (**(code **)**(undefined8 **)(in_RDI + 0x58))
            (&local_70,*(undefined8 **)(in_RDI + 0x58),&stack0x00000008);
  bVar2 = Primitive::Hit::operator_cast_to_bool(&local_70);
  if (bVar2) {
    if (*local_28 != 0) {
      BSDF::bump(in_stack_000000c0,in_stack_000000b8);
    }
    local_c.x = local_70.Ns.x;
    local_c.y = local_70.Ns.y;
    local_c.z = local_70.Ns.z;
  }
  else {
    vec3f::vec3f(&local_c);
  }
  CVar1.z = local_c.z;
  CVar1.x = local_c.x;
  CVar1.y = local_c.y;
  return CVar1;
}

Assistant:

Color Renderer::normal(Ray ray, Sampler&) {
	HitInfo hit = acc->hit(ray);
	if (!hit) {
		return Color();
	}
	if (hit.object->bsdf)
		hit.object->bsdf->bump(hit);
	return hit.Ns;
}